

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O1

void wallet::wallet_tests::AddKey(CWallet *wallet,CKey *key)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ScriptPubKeyMan *pSVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long in_FS_OFFSET;
  shared_ptr<Descriptor> descriptor;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  descs;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  WalletDescriptor w_desc;
  string error;
  FlatSigningProvider provider;
  int32_t in_stack_fffffffffffffd58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2a0;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  local_298;
  unique_lock<std::recursive_mutex> local_280;
  undefined1 local_270 [72];
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_228;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1f0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1b8;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  FlatSigningProvider local_120;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_280._M_device = &(wallet->cs_wallet).super_recursive_mutex;
  local_280._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_280);
  local_120.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_120.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
  local_120.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FlatSigningProvider_013bcda8;
  local_120.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_120.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_120.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_120.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_120.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_120.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_120.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_120.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_120.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_120.origins._M_t._M_impl.super__Rb_tree_header._M_header;
  local_120.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_120.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_120.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_120.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_120.keys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_120.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_120.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_120.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_120.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_120.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
  local_120.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_120.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_120.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_140._M_string_length = 0;
  local_140.field_2._M_local_buf[0] = '\0';
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  local_120.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_120.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_120.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_120.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_120.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_120.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_120.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_120.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_120.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_120.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  EncodeSecret_abi_cxx11_(&local_180,key);
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_180,0,0,"combo(",6);
  paVar1 = &local_160.field_2;
  local_160._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  paVar4 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p == paVar4) {
    local_160.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_160.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_160._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_160.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_160._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_160,")");
  local_270._0_8_ = (pbVar2->_M_dataplus)._M_p;
  paVar4 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._0_8_ == paVar4) {
    local_270._16_8_ = paVar4->_M_allocated_capacity;
    local_270._24_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_270._0_8_ = local_270 + 0x10;
  }
  else {
    local_270._16_8_ = paVar4->_M_allocated_capacity;
  }
  local_270._8_8_ = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  Parse(&local_298,(string *)local_270,&local_120,&local_140,false);
  if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
    operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((long)local_298.
            super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_298.
            super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 8) {
    __assert_fail("descs.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                  ,0x45,"void wallet::wallet_tests::AddKey(CWallet &, const CKey &)");
  }
  std::__shared_ptr<Descriptor,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Descriptor,std::default_delete<Descriptor>,void>
            ((__shared_ptr<Descriptor,(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffd58,
             local_298.
             super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&stack0xfffffffffffffd58;
  WalletDescriptor::WalletDescriptor
            ((WalletDescriptor *)local_270,descriptor,0,1,1,in_stack_fffffffffffffd58);
  if (local_2a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2a0);
  }
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"");
  pSVar3 = CWallet::AddWalletDescriptor
                     (wallet,(WalletDescriptor *)local_270,&local_120,&local_160,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (pSVar3 == (ScriptPubKeyMan *)0x0) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                  ,0x48,"void wallet::wallet_tests::AddKey(CWallet &, const CKey &)");
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_1b8);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_1f0);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_228);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._8_8_);
  }
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::~vector(&local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,
                    CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                             local_140.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  ::~_Rb_tree(&local_120.tr_trees._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree(&local_120.keys._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  ::~_Rb_tree(&local_120.origins._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  ::~_Rb_tree(&local_120.pubkeys._M_t);
  std::
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  ::~_Rb_tree(&local_120.scripts._M_t);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_280);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void AddKey(CWallet& wallet, const CKey& key)
{
    LOCK(wallet.cs_wallet);
    FlatSigningProvider provider;
    std::string error;
    auto descs = Parse("combo(" + EncodeSecret(key) + ")", provider, error, /* require_checksum=*/ false);
    assert(descs.size() == 1);
    auto& desc = descs.at(0);
    WalletDescriptor w_desc(std::move(desc), 0, 0, 1, 1);
    if (!wallet.AddWalletDescriptor(w_desc, provider, "", false)) assert(false);
}